

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaptexture.cpp
# Opt level: O1

void __thiscall FAutomapTexture::MakeTexture(FAutomapTexture *this)

{
  ushort uVar1;
  FString in_RAX;
  BYTE *pBVar2;
  ulong uVar3;
  FResourceFile **ppFVar4;
  ulong uVar5;
  ulong uVar6;
  FMemLump FVar7;
  FMemLump data;
  FMemLump local_18;
  
  local_18.Block.Chars = (FString)(FString)in_RAX.Chars;
  FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffe8,0xa861c0);
  FVar7.Block.Chars = (FString)(FString)(FResourceFile **)0x0;
  if (*(int *)((long)local_18.Block.Chars + -0xc) != 0) {
    FVar7.Block.Chars = local_18.Block.Chars;
  }
  pBVar2 = (BYTE *)operator_new__((ulong)(this->super_FTexture).Height *
                                  (ulong)(this->super_FTexture).Width);
  this->Pixels = pBVar2;
  if ((this->super_FTexture).Width != 0) {
    uVar3 = 0;
    do {
      uVar1 = (this->super_FTexture).Height;
      uVar6 = (ulong)uVar1;
      if (uVar1 != 0) {
        uVar5 = 0;
        ppFVar4 = (FResourceFile **)FVar7.Block.Chars;
        do {
          this->Pixels[uVar5 + uVar6 * uVar3] = *(BYTE *)ppFVar4;
          uVar5 = uVar5 + 1;
          uVar6 = (ulong)(this->super_FTexture).Height;
          ppFVar4 = ppFVar4 + 0x28;
        } while (uVar5 < uVar6);
      }
      uVar3 = uVar3 + 1;
      FVar7.Block.Chars = (FString)((long)FVar7.Block.Chars + 1);
    } while (uVar3 < (this->super_FTexture).Width);
  }
  FMemLump::~FMemLump(&stack0xffffffffffffffe8);
  return;
}

Assistant:

void FAutomapTexture::MakeTexture ()
{
	int x, y;
	FMemLump data = Wads.ReadLump (SourceLump);
	const BYTE *indata = (const BYTE *)data.GetMem();

	Pixels = new BYTE[Width * Height];

	for (x = 0; x < Width; ++x)
	{
		for (y = 0; y < Height; ++y)
		{
			Pixels[x*Height+y] = indata[x+320*y];
		}
	}
}